

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

pair<int,_int> __thiscall Imf_3_4::DeepScanLineInputFile::Data::getChunkRange(Data *this,int y)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *pAVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  exr_attr_box2i_t eVar10;
  int32_t scansperchunk;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  uVar7 = (ulong)(uint)y;
  eVar10 = Context::dataWindow(this->_ctxt,this->partNumber);
  scansperchunk = 1;
  if ((eVar10.min.y <= y) && (y <= eVar10.max.y)) {
    iVar1 = exr_get_scanlines_per_chunk
                      (*(this->_ctxt->_ctxt).
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,this->partNumber,&scansperchunk);
    if (iVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar2 = std::operator<<(local_1a8,"Error querying scanline counts from image file \"");
      pcVar3 = Context::fileName(this->_ctxt);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"\".");
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar4,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    lVar5 = (long)scansperchunk;
    uVar9 = uVar7;
    if (lVar5 != 1) {
      lVar8 = (long)eVar10.min >> 0x20;
      lVar6 = y - lVar8;
      uVar7 = (lVar6 - lVar6 % lVar5) + lVar8;
      uVar9 = (long)eVar10.max >> 0x20;
      if ((long)(uVar7 + lVar5) <= (long)uVar9) {
        uVar9 = uVar7 + lVar5;
      }
    }
    return (pair<int,_int>)(uVar7 & 0xffffffff | uVar9 << 0x20);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_1a8,"Requested scanline ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,y);
  poVar2 = std::operator<<(poVar2," is outside the image file\'s data window: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,eVar10.min.y);
  poVar2 = std::operator<<(poVar2," - ");
  std::ostream::operator<<((ostream *)poVar2,eVar10.max.y);
  pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar4,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

std::pair<int, int> DeepScanLineInputFile::Data::getChunkRange (int y) const
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    int32_t scansperchunk = 1;

    if (y < dw.min.y || y > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Requested scanline " << y << " is outside "
            "the image file's data window: "
            << dw.min.y << " - " << dw.max.y);
    }

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scansperchunk == 1)
        return std::make_pair( y, y );

    std::pair<int, int> ret;
    int64_t yoff;

    yoff = (int64_t) y;
    yoff -= (int64_t) dw.min.y;
    yoff /= (int64_t) scansperchunk;

    yoff *= (int64_t) scansperchunk;
    yoff += (int64_t) dw.min.y;

    ret.first = (int32_t) yoff;
    yoff += (int64_t) scansperchunk;
    yoff = std::min (yoff, (int64_t) dw.max.y);
    ret.second = (int32_t) yoff;

    return ret;
}